

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

void __thiscall Layer::compile(Layer *this,uint row)

{
  Shape local_34;
  
  (this->m_shape).n_row = row;
  local_34.n_col = (this->m_shape).n_col;
  local_34.n_row = 1;
  local_34.is_diogonal = false;
  Matrix<double>::reshape(&this->m_inputs,&local_34);
  local_34.n_row = 1;
  local_34.is_diogonal = false;
  local_34.n_col = row;
  Matrix<double>::reshape(&this->m_outputs,&local_34);
  Matrix<double>::reshape(&this->m_weights,&this->m_shape);
  Matrix<double>::initialize(&this->m_weights,1.0,2.0);
  return;
}

Assistant:

void Layer::compile(unsigned row){
    m_shape.n_row=row;

    m_inputs.reshape(1, m_shape.n_col);
    m_outputs.reshape(1, row);
    m_weights.reshape(m_shape);

    m_weights.initialize(1, 2);
}